

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Disk::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Disk *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  Transform *this_00;
  undefined1 auVar5 [16];
  float fVar6;
  Point3fi pi;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Vector3<float> wo_00;
  Vector3f dpdu;
  Vector3f dpdv;
  Point3f pHit;
  undefined8 local_198;
  ulong local_188;
  Point2f local_178;
  Tuple3<pbrt::Vector3,_float> local_160;
  Point3f local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  local_150.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_150.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_150.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar1 = this->phiMax;
  fVar2 = this->radius;
  local_150.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  local_160.x = 0.0;
  local_160.y = 0.0;
  local_160.z = 0.0;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar5);
  auVar5 = vmovshdup_avx(auVar10);
  fVar6 = this->innerRadius - fVar2;
  fVar11 = auVar5._0_4_;
  bVar3 = this->reverseOrientation;
  bVar4 = this->transformSwapsHandedness;
  auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar2 - this->innerRadius)),0x10);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar10,auVar10);
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar12 = auVar8._0_4_;
  auVar8 = vinsertps_avx(ZEXT416((uint)isect->phi),ZEXT416((uint)(fVar2 - fVar12)),0x10);
  auVar5 = vdivps_avx(auVar8,auVar5);
  auVar7 = vinsertps_avx(ZEXT416((uint)(fVar11 * auVar7._0_4_)),
                         ZEXT416((uint)(fVar1 * (float)local_150.super_Tuple3<pbrt::Point3,_float>.x
                                       )),0x10);
  auVar9._4_4_ = fVar12;
  auVar9._0_4_ = fVar12;
  auVar9._8_4_ = fVar12;
  auVar9._12_4_ = fVar12;
  auVar8._0_4_ = fVar6 * (float)local_150.super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = fVar6 * (float)local_150.super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._8_4_ = fVar6 * 0.0;
  auVar8._12_4_ = fVar6 * 0.0;
  auVar8 = vdivps_avx(auVar8,auVar9);
  wo_00 = Transform::operator()(this->objectFromRender,wo);
  this_00 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&local_150,(Vector3f *)&local_160);
  local_178.super_Tuple2<pbrt::Point2,_float> = auVar5._0_8_;
  local_188 = auVar7._0_8_;
  local_198 = auVar8._0_8_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_188;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (fVar6 * 0.0) / fVar12;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_198;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_198._4_4_;
  SurfaceInteraction::SurfaceInteraction
            (&local_128,pi,local_178,(Vector3f)wo_00.super_Tuple3<pbrt::Vector3,_float>,dpdu,dpdv,
             (Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),time,bVar3 != bVar4);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of disk hit
        Float u = phi / phiMax;
        Float rHit = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        Float v = (radius - rHit) / (radius - innerRadius);
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
        Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

        // Refine disk intersection point
        pHit.z = height;

        // Compute error bounds for disk intersection
        Vector3f pError(0, 0, 0);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }